

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_pcache * pcache1Create(int szPage,int szExtra,int bPurgeable)

{
  PgHdr1 *pPVar1;
  uint uVar2;
  PCache1 *p;
  PCacheGlobal *pPVar3;
  uint *puVar4;
  
  p = (PCache1 *)sqlite3MallocZero((long)(pcache1_g.separateCache * 0x50 + 0x58));
  if (p != (PCache1 *)0x0) {
    if (pcache1_g.separateCache == 0) {
      pPVar3 = &pcache1_g;
    }
    else {
      pPVar3 = (PCacheGlobal *)(p + 1);
      p[1].szPage = 10;
    }
    if ((pPVar3->grp).lru.isAnchor == 0) {
      pPVar1 = &(pPVar3->grp).lru;
      (pPVar3->grp).lru.isAnchor = 1;
      (pPVar3->grp).lru.pLruNext = pPVar1;
      (pPVar3->grp).lru.pLruPrev = pPVar1;
    }
    p->pGroup = &pPVar3->grp;
    p->szPage = szPage;
    p->szExtra = szExtra;
    p->szAlloc = szPage + szExtra + 0x38;
    p->bPurgeable = (uint)(bPurgeable != 0);
    pcache1ResizeHash(p);
    if (bPurgeable == 0) {
      puVar4 = &p->nPurgeableDummy;
    }
    else {
      p->nMin = 10;
      uVar2 = (pPVar3->grp).nMinPage;
      (pPVar3->grp).nMinPage = uVar2 + 10;
      (pPVar3->grp).mxPinned = (pPVar3->grp).nMaxPage - uVar2;
      puVar4 = &(pPVar3->grp).nPurgeable;
    }
    p->pnPurgeable = puVar4;
    if (p->nHash != 0) {
      return (sqlite3_pcache *)p;
    }
    pcache1Destroy((sqlite3_pcache *)p);
  }
  return (sqlite3_pcache *)0x0;
}

Assistant:

static sqlite3_pcache *pcache1Create(int szPage, int szExtra, int bPurgeable){
  PCache1 *pCache;      /* The newly created page cache */
  PGroup *pGroup;       /* The group the new page cache will belong to */
  int sz;               /* Bytes of memory required to allocate the new cache */

  assert( (szPage & (szPage-1))==0 && szPage>=512 && szPage<=65536 );
  assert( szExtra < 300 );

  sz = sizeof(PCache1) + sizeof(PGroup)*pcache1.separateCache;
  pCache = (PCache1 *)sqlite3MallocZero(sz);
  if( pCache ){
    if( pcache1.separateCache ){
      pGroup = (PGroup*)&pCache[1];
      pGroup->mxPinned = 10;
    }else{
      pGroup = &pcache1.grp;
    }
    if( pGroup->lru.isAnchor==0 ){
      pGroup->lru.isAnchor = 1;
      pGroup->lru.pLruPrev = pGroup->lru.pLruNext = &pGroup->lru;
    }
    pCache->pGroup = pGroup;
    pCache->szPage = szPage;
    pCache->szExtra = szExtra;
    pCache->szAlloc = szPage + szExtra + ROUND8(sizeof(PgHdr1));
    pCache->bPurgeable = (bPurgeable ? 1 : 0);
    pcache1EnterMutex(pGroup);
    pcache1ResizeHash(pCache);
    if( bPurgeable ){
      pCache->nMin = 10;
      pGroup->nMinPage += pCache->nMin;
      pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
      pCache->pnPurgeable = &pGroup->nPurgeable;
    }else{
      pCache->pnPurgeable = &pCache->nPurgeableDummy;
    }
    pcache1LeaveMutex(pGroup);
    if( pCache->nHash==0 ){
      pcache1Destroy((sqlite3_pcache*)pCache);
      pCache = 0;
    }
  }
  return (sqlite3_pcache *)pCache;
}